

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O1

string_type * __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_literal<char_const*>
          (string_type *__return_storage_ptr__,
          regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          *this,char **begin,char *end)

{
  regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
  *prVar1;
  compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
  *this_00;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  compiler_token_type cVar5;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar6;
  char *pcVar7;
  escape_value eVar8;
  char *tmp;
  char *local_68;
  ulong local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
  *local_50;
  quant_spec local_48;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  local_50 = this;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  pcVar7 = *begin;
  local_68 = pcVar7 + 1;
  *begin = local_68;
  if (local_68 != end) {
    prVar1 = local_50 + 8;
    this_00 = (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
               *)(local_50 + 0x10);
    local_60 = 0;
    do {
      local_48.greedy_ = false;
      local_48.min_ = 0;
      local_48.max_ = 0;
      local_48.hidden_mark_count_ = (size_t *)prVar1;
      bVar4 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              ::get_quant_spec<char_const*>(this_00,&local_68,end,&local_48);
      if (bVar4) {
        sVar2 = __return_storage_ptr__->_M_string_length;
        local_60 = CONCAT71(extraout_var,1);
        if (sVar2 != 1) {
          *begin = pcVar7;
          std::__cxx11::string::_M_erase((ulong)__return_storage_ptr__,sVar2 - 1);
        }
        bVar4 = false;
      }
      else {
        cVar5 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                ::get_token<char_const*>(this_00,&local_68,end);
        uVar6 = CONCAT44(extraout_var_00,cVar5);
        if (cVar5 == token_literal) {
          local_68 = local_68 + 1;
          bVar4 = true;
          std::__cxx11::string::_M_replace_aux
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01'
                    );
        }
        else {
          if (cVar5 == token_escape) {
            eVar8 = parse_escape<char_const*>(local_50,&local_68,end);
            uVar6 = eVar8._0_8_;
            if (eVar8._8_8_ >> 0x20 == 0) {
              bVar4 = true;
              std::__cxx11::string::_M_replace_aux
                        ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                         '\x01');
              goto LAB_0012a79b;
            }
          }
          bVar4 = false;
          local_60 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
        }
      }
LAB_0012a79b:
      if (!bVar4) {
        if ((local_60 & 1) != 0) {
          return __return_storage_ptr__;
        }
        pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == local_58) {
          return __return_storage_ptr__;
        }
        operator_delete(pcVar3);
        return __return_storage_ptr__;
      }
      pcVar7 = *begin;
      *begin = local_68;
    } while (local_68 != end);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type parse_literal(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        BOOST_ASSERT(begin != end);
        BOOST_ASSERT(token_literal == this->traits_.get_token(begin, end));
        escape_value esc = { 0, 0, 0, detail::escape_char };
        string_type literal(1, *begin);

        for(FwdIter prev = begin, tmp = ++begin; begin != end; prev = begin, begin = tmp)
        {
            detail::quant_spec spec = { 0, 0, false, &this->hidden_mark_count_ };
            if(this->traits_.get_quant_spec(tmp, end, spec))
            {
                if(literal.size() != 1)
                {
                    begin = prev;
                    literal.erase(boost::prior(literal.end()));
                }
                return literal;
            }
            else switch(this->traits_.get_token(tmp, end))
            {
            case token_escape:
                esc = this->parse_escape(tmp, end);
                if(detail::escape_char != esc.type_) return literal;
                literal.insert(literal.end(), esc.ch_);
                break;
            case token_literal:
                literal.insert(literal.end(), *tmp++);
                break;
            default:
                return literal;
            }
        }

        return literal;
    }